

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1513.c
# Opt level: O0

int progressKiller(void *arg,double dltotal,double dlnow,double ultotal,double ulnow)

{
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *arg_local;
  
  curl_mprintf("PROGRESSFUNCTION called\n");
  return 1;
}

Assistant:

static int progressKiller(void *arg,
                          double dltotal,
                          double dlnow,
                          double ultotal,
                          double ulnow)
{
  (void)arg;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  printf("PROGRESSFUNCTION called\n");
  return 1;
}